

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascOpenStorage.cpp
# Opt level: O2

bool CascGetStorageInfo(HANDLE hStorage,CASC_STORAGE_INFO_CLASS InfoClass,void *pvStorageInfo,
                       size_t cbStorageInfo,size_t *pcbLengthNeeded)

{
  DWORD dwErrCode;
  uint uVar1;
  TCascStorage *pTVar2;
  
  pTVar2 = IsValidCascStorageHandle(hStorage);
  if (pTVar2 == (TCascStorage *)0x0) {
    dwErrCode = 9;
  }
  else {
    switch(InfoClass) {
    case CascStorageFileCount:
      uVar1 = (uint)pTVar2->pEKeyEntryMap->ItemCount;
      break;
    case CascStorageFeatures:
      uVar1 = pTVar2->pRootHandler->dwRootFlags & 1;
      break;
    case CascStorageGameInfo:
      uVar1 = pTVar2->dwGameInfo;
      break;
    case CascStorageGameBuild:
      uVar1 = pTVar2->dwBuildNumber;
      break;
    case CascStorageInstalledLocales:
      uVar1 = pTVar2->dwDefaultLocale;
      break;
    default:
      dwErrCode = 0x16;
      goto LAB_00114a6f;
    }
    if (3 < cbStorageInfo) {
      *(uint *)pvStorageInfo = uVar1;
      return true;
    }
    *pcbLengthNeeded = 4;
    dwErrCode = 0x69;
  }
LAB_00114a6f:
  SetLastError(dwErrCode);
  return false;
}

Assistant:

bool WINAPI CascGetStorageInfo(
    HANDLE hStorage,
    CASC_STORAGE_INFO_CLASS InfoClass,
    void * pvStorageInfo,
    size_t cbStorageInfo,
    size_t * pcbLengthNeeded)
{
    TCascStorage * hs;
    DWORD dwInfoValue = 0;

    // Verify the storage handle
    hs = IsValidCascStorageHandle(hStorage);
    if(hs == NULL)
    {
        SetLastError(ERROR_INVALID_HANDLE);
        return false;
    }

    // Differentiate between info classes
    switch(InfoClass)
    {
        case CascStorageFileCount:
            dwInfoValue = (DWORD)hs->pEKeyEntryMap->ItemCount;
            break;

        case CascStorageFeatures:
            dwInfoValue |= (hs->pRootHandler->GetFlags() & ROOT_FLAG_HAS_NAMES) ? CASC_FEATURE_HAS_NAMES : 0;
            break;

        case CascStorageGameInfo:
            dwInfoValue = hs->dwGameInfo;
            break;

        case CascStorageGameBuild:
            dwInfoValue = hs->dwBuildNumber;
            break;

        case CascStorageInstalledLocales:
            dwInfoValue = hs->dwDefaultLocale;
            break;

        default:
            SetLastError(ERROR_INVALID_PARAMETER);
            return false;
    }

    //
    // Return the required DWORD value
    //

    if(cbStorageInfo < sizeof(DWORD))
    {
        *pcbLengthNeeded = sizeof(DWORD);
        SetLastError(ERROR_INSUFFICIENT_BUFFER);
        return false;
    }

    // Give the number of files
    *(PDWORD)pvStorageInfo = dwInfoValue;
    return true;
}